

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_vacuum.cpp
# Opt level: O3

VacuumOptions duckdb::ParseOptions(int32_t options)

{
  NotImplementedException *pNVar1;
  string local_40;
  
  if ((options & 4U) != 0) {
    pNVar1 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Verbose vacuum option","");
    NotImplementedException::NotImplementedException(pNVar1,&local_40);
    __cxa_throw(pNVar1,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((options & 8U) != 0) {
    pNVar1 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Freeze vacuum option","")
    ;
    NotImplementedException::NotImplementedException(pNVar1,&local_40);
    __cxa_throw(pNVar1,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((options & 0x10U) != 0) {
    pNVar1 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Full vacuum option","");
    NotImplementedException::NotImplementedException(pNVar1,&local_40);
    __cxa_throw(pNVar1,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((options & 0x20U) == 0) {
    if ((options & 0x40U) != 0) {
      pNVar1 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Skip Toast vacuum option","");
      NotImplementedException::NotImplementedException(pNVar1,&local_40);
      __cxa_throw(pNVar1,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (-1 < (char)options) {
      return (VacuumOptions)((ushort)((options & 2U) << 7) | (ushort)options & 1);
    }
    pNVar1 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Disable Page Skipping vacuum option","");
    NotImplementedException::NotImplementedException(pNVar1,&local_40);
    __cxa_throw(pNVar1,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pNVar1 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"No Wait vacuum option","");
  NotImplementedException::NotImplementedException(pNVar1,&local_40);
  __cxa_throw(pNVar1,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

VacuumOptions ParseOptions(const int32_t options) {
	VacuumOptions result;
	if (options & duckdb_libpgquery::PGVacuumOption::PG_VACOPT_VACUUM) {
		result.vacuum = true;
	}
	if (options & duckdb_libpgquery::PGVacuumOption::PG_VACOPT_ANALYZE) {
		result.analyze = true;
	}
	if (options & duckdb_libpgquery::PGVacuumOption::PG_VACOPT_VERBOSE) {
		throw NotImplementedException("Verbose vacuum option");
	}
	if (options & duckdb_libpgquery::PGVacuumOption::PG_VACOPT_FREEZE) {
		throw NotImplementedException("Freeze vacuum option");
	}
	if (options & duckdb_libpgquery::PGVacuumOption::PG_VACOPT_FULL) {
		throw NotImplementedException("Full vacuum option");
	}
	if (options & duckdb_libpgquery::PGVacuumOption::PG_VACOPT_NOWAIT) {
		throw NotImplementedException("No Wait vacuum option");
	}
	if (options & duckdb_libpgquery::PGVacuumOption::PG_VACOPT_SKIPTOAST) {
		throw NotImplementedException("Skip Toast vacuum option");
	}
	if (options & duckdb_libpgquery::PGVacuumOption::PG_VACOPT_DISABLE_PAGE_SKIPPING) {
		throw NotImplementedException("Disable Page Skipping vacuum option");
	}
	return result;
}